

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>::~Array
          (Array<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>_>
           *this)

{
  Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *pMVar1;
  size_t sVar2;
  
  pMVar1 = this->ptr;
  if (pMVar1 != (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0)
  {
    sVar2 = this->size_;
    this->ptr = (Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pMVar1,0x20,sVar2,sVar2,
               ArrayDisposer::
               Dispose_<kj::Maybe<capnp::compiler::(anonymous_namespace)::Located<capnp::Text::Reader>_>,_false>
               ::destruct);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }